

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_string(char *value)

{
  LOGGER_LOG p_Var1;
  size_t sVar2;
  void *pvVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  size_t malloc_size;
  size_t length;
  LOGGER_LOG l;
  AMQP_VALUE result;
  char *value_local;
  
  if (value == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_string",0x42b,1,"NULL argument value");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    sVar2 = strlen(value);
    sVar2 = sVar2 + 1;
    if (sVar2 == 0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_string",0x437,1,"Invalid string size exceeded max allocation");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      l = (LOGGER_LOG)REFCOUNT_AMQP_VALUE_DATA_Create();
    }
    if (l == (LOGGER_LOG)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_string",0x442,1,"Could not allocate memory for AMQP value");
      }
    }
    else {
      *(undefined4 *)l = 0x11;
      pvVar3 = malloc(sVar2);
      *(void **)(l + 8) = pvVar3;
      if (*(long *)(l + 8) == 0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_create_string",1099,1,
                    "Could not allocate memory for string AMQP value");
        }
        REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        memcpy(*(void **)(l + 8),value,sVar2);
      }
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_create_string(const char* value)
{
    AMQP_VALUE result;
    if (value == NULL)
    {
        LogError("NULL argument value");
        result = NULL;
    }
    else
    {
        size_t length = strlen(value);
        size_t malloc_size = length + 1;

        // If the result of malloc_size is zero it means it had a type overflow (size_t is an unsigned type).
        // It is very unlikely but could happen.
        if (malloc_size == 0)
        {
            LogError("Invalid string size exceeded max allocation");
            result = NULL;
        }
        else
        {
            result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        }

        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            result->type = AMQP_TYPE_STRING;
            result->value.string_value.chars = (char*)malloc(malloc_size);
            if (result->value.string_value.chars == NULL)
            {
                /* Codes_SRS_AMQPVALUE_01_136: [If allocating the AMQP_VALUE fails then amqpvalue_create_string shall return NULL.] */
                LogError("Could not allocate memory for string AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                (void)memcpy(result->value.string_value.chars, value, malloc_size);
            }
        }
    }

    return result;
}